

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDException.hpp
# Opt level: O0

void __thiscall OpenMD::OpenMDException::OpenMDException(OpenMDException *this,string *msg)

{
  string *in_RSI;
  exception *in_RDI;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__OpenMDException_00505cc8;
  std::__cxx11::string::string((string *)(in_RDI + 8),in_RSI);
  return;
}

Assistant:

OpenMDException() : msg_("") {}